

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_verifier.h
# Opt level: O0

int Fantasy_Character_union_verifier(flatcc_union_verifier_descriptor_t *ud)

{
  flatbuffers_utype_t fVar1;
  flatcc_union_verifier_descriptor_t *ud_local;
  
  fVar1 = ud->type;
  if (fVar1 == '\x02') {
    ud_local._4_4_ = flatcc_verify_union_table(ud,Fantasy_Attacker_verify_table);
  }
  else if (fVar1 == '\b') {
    ud_local._4_4_ = flatcc_verify_union_struct(ud,8,4);
  }
  else if (fVar1 == '\t') {
    ud_local._4_4_ = flatcc_verify_union_struct(ud,4,4);
  }
  else if (fVar1 == '\n') {
    ud_local._4_4_ = flatcc_verify_union_struct(ud,4,4);
  }
  else if (fVar1 == '\v') {
    ud_local._4_4_ = flatcc_verify_union_string(ud);
  }
  else if (fVar1 == 0xff) {
    ud_local._4_4_ = flatcc_verify_union_string(ud);
  }
  else {
    ud_local._4_4_ = 0;
  }
  return ud_local._4_4_;
}

Assistant:

static int Fantasy_Character_union_verifier(flatcc_union_verifier_descriptor_t *ud)
{
    switch (ud->type) {
    case 2: return flatcc_verify_union_table(ud, Fantasy_Attacker_verify_table); /* MuLan */
    case 8: return flatcc_verify_union_struct(ud, 8, 4); /* Rapunzel */
    case 9: return flatcc_verify_union_struct(ud, 4, 4); /* Belle */
    case 10: return flatcc_verify_union_struct(ud, 4, 4); /* BookFan */
    case 11: return flatcc_verify_union_string(ud); /* Other */
    case 255: return flatcc_verify_union_string(ud); /* Unused */
    default: return flatcc_verify_ok;
    }
}